

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuBar.cpp
# Opt level: O0

void __thiscall gui::MenuBar::handleMouseLeft(MenuBar *this)

{
  MenuBar *in_RDI;
  MenuBar *unaff_retaddr;
  bool in_stack_ffffffffffffffeb;
  int in_stack_ffffffffffffffec;
  
  if ((in_RDI->menuIsOpen_ & 1U) == 0) {
    selectMenu(in_RDI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffeb);
  }
  else {
    selectMenuItem(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  }
  Widget::handleMouseLeft((Widget *)0x2548d8);
  return;
}

Assistant:

void MenuBar::handleMouseLeft() {
    if (!menuIsOpen_) {
        selectMenu(-1, false);
    } else {
        selectMenuItem(-1);
    }
    baseClass::handleMouseLeft();
}